

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O2

KBOOL __thiscall KDIS::DATA_TYPE::ConeRecord1::operator==(ConeRecord1 *this,ConeRecord1 *Value)

{
  KBOOL KVar1;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if (((!KVar1) && (KVar1 = WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc), !KVar1)) &&
     (KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1)) {
    if (((float)this->m_f32Height == (float)Value->m_f32Height) &&
       (!NAN((float)this->m_f32Height) && !NAN((float)Value->m_f32Height))) {
      return (KBOOL)(-((float)Value->m_f32PeakAngle == (float)this->m_f32PeakAngle) & 1);
    }
  }
  return false;
}

Assistant:

KBOOL ConeRecord1::operator == ( const ConeRecord1 & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) ) return false;
    if( m_Loc          != Value.m_Loc )           return false;
    if( m_Ori          != Value.m_Ori )           return false;
    if( m_f32Height    != Value.m_f32Height )     return false;
    if( m_f32PeakAngle != Value.m_f32PeakAngle )  return false;
    return true;
}